

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

xmlTextWriterPtr xmlNewTextWriterMemory(xmlBufferPtr buf,int compression)

{
  xmlOutputBufferPtr out_00;
  xmlOutputBufferPtr out;
  xmlTextWriterPtr ret;
  int compression_local;
  xmlBufferPtr buf_local;
  
  out_00 = xmlOutputBufferCreateBuffer(buf,(xmlCharEncodingHandlerPtr)0x0);
  if (out_00 == (xmlOutputBufferPtr)0x0) {
    xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_NO_MEMORY,
                    "xmlNewTextWriterMemory : out of memory!\n");
    buf_local = (xmlBufferPtr)0x0;
  }
  else {
    buf_local = (xmlBufferPtr)xmlNewTextWriter(out_00);
    if ((xmlTextWriterPtr)buf_local == (xmlTextWriterPtr)0x0) {
      xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_NO_MEMORY,
                      "xmlNewTextWriterMemory : out of memory!\n");
      xmlOutputBufferClose(out_00);
      buf_local = (xmlBufferPtr)0x0;
    }
  }
  return (xmlTextWriterPtr)buf_local;
}

Assistant:

xmlTextWriterPtr
xmlNewTextWriterMemory(xmlBufferPtr buf, int compression ATTRIBUTE_UNUSED)
{
    xmlTextWriterPtr ret;
    xmlOutputBufferPtr out;

/*::todo handle compression */
    out = xmlOutputBufferCreateBuffer(buf, NULL);

    if (out == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_NO_MEMORY,
                        "xmlNewTextWriterMemory : out of memory!\n");
        return NULL;
    }

    ret = xmlNewTextWriter(out);
    if (ret == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_NO_MEMORY,
                        "xmlNewTextWriterMemory : out of memory!\n");
        xmlOutputBufferClose(out);
        return NULL;
    }

    return ret;
}